

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNESTFluctuationBenchmarks.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  VDetector *detector;
  RandomGen *this;
  ostream *poVar2;
  size_t ii_1;
  pointer pdVar3;
  size_type __n;
  double *pdVar4;
  long lVar5;
  LArNESTResult *pLVar6;
  size_t i;
  long lVar7;
  ulong uVar8;
  size_t j;
  uint64_t s;
  size_type sVar9;
  ulong uVar10;
  byte bVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  initializer_list<NEST::LArInteraction> __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<double> __l_01;
  initializer_list<double> __l_02;
  initializer_list<double> __l_03;
  double local_9b8;
  double local_9b0;
  double local_9a8;
  double local_9a0;
  vector<double,_std::allocator<double>_> energy_vals;
  vector<double,_std::allocator<double>_> electric_field;
  double local_928;
  vector<double,_std::allocator<double>_> Nion;
  vector<double,_std::allocator<double>_> Nex;
  vector<double,_std::allocator<double>_> Ne;
  vector<double,_std::allocator<double>_> Nph;
  vector<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_> particle_types;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  particle_type;
  LArNESTResult result;
  LArNESTResult local_808;
  ofstream output_file;
  LArNEST larnest;
  
  bVar11 = 0;
  __n = 100;
  if (argc < 2) {
    local_928 = 1.393;
  }
  else {
    local_928 = atof(argv[1]);
    if (argc != 2) {
      iVar1 = atoi(argv[2]);
      s = (uint64_t)iVar1;
      if (3 < (uint)argc) {
        iVar1 = atoi(argv[3]);
        __n = (size_type)iVar1;
      }
      goto LAB_001039d4;
    }
  }
  s = 0;
LAB_001039d4:
  energy_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  energy_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  energy_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  for (lVar7 = 0; lVar7 != 50000; lVar7 = lVar7 + 1) {
    larnest.super_NESTcalc._vptr_NESTcalc = (_func_int **)((double)lVar7 * 0.019998 + 0.1);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&energy_vals,(double *)&larnest);
  }
  larnest.super_NESTcalc._vptr_NESTcalc = (_func_int **)0x100000000;
  larnest.super_NESTcalc.fdetector._0_4_ = 2;
  __l._M_len = 3;
  __l._M_array = (iterator)&larnest;
  std::vector<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>::vector
            (&particle_types,__l,(allocator_type *)&output_file);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&larnest,"NR",(allocator<char> *)&output_file);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&larnest.super_NESTcalc.field_0x20,"ER",(allocator<char> *)&result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&larnest.super_NESTcalc.field_0x40,"Alpha",(allocator<char> *)&local_808);
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&larnest;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&particle_type,__l_00,(allocator_type *)&electric_field);
  lVar7 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)&larnest.super_NESTcalc._vptr_NESTcalc + lVar7));
    lVar7 = lVar7 + -0x20;
  } while (lVar7 != -0x20);
  detector = (VDetector *)operator_new(0x128);
  LArDetector::LArDetector((LArDetector *)detector);
  NEST::LArNEST::LArNEST(&larnest,detector);
  this = RandomGen::rndm();
  RandomGen::SetSeed(this,s);
  result.photon_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  result.photon_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  result.photon_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::ofstream::ofstream(&output_file);
  std::ofstream::open((char *)&output_file,0x115284);
  std::operator<<((ostream *)&output_file,
                  "type,energy,efield,TotalYield,QuantaYield,LightYield,Nph,Ne,Nex,Nion,TotalYield_std,QuantaYield_std,LightYield_std,Nph_std,Ne_std,Nex_std,Nion_std\n"
                 );
  auVar15._8_4_ = (int)(__n >> 0x20);
  auVar15._0_8_ = __n;
  auVar15._12_4_ = 0x45300000;
  dVar16 = (auVar15._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)__n) - 4503599627370496.0);
  uVar8 = 0;
  while( true ) {
    if ((ulong)((long)particle_types.
                      super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)particle_types.
                      super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 2) <= uVar8) break;
    electric_field.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    electric_field.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    electric_field.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (particle_types.
        super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>._M_impl.
        super__Vector_impl_data._M_start[uVar8] == ER) {
      pdVar4 = (double *)&DAT_001151c8;
      pLVar6 = &local_808;
      for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pLVar6->yields).TotalYield = *pdVar4;
        pdVar4 = pdVar4 + (ulong)bVar11 * -2 + 1;
        pLVar6 = (LArNESTResult *)((long)pLVar6 + (ulong)bVar11 * -0x10 + 8);
      }
      __l_02._M_len = 10;
      __l_02._M_array = (iterator)&local_808;
      std::vector<double,_std::allocator<double>_>::insert
                (&electric_field,(const_iterator)0x0,__l_02);
    }
    else if (particle_types.
             super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>._M_impl
             .super__Vector_impl_data._M_start[uVar8] == NR) {
      pdVar4 = (double *)&DAT_00115178;
      pLVar6 = &local_808;
      for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pLVar6->yields).TotalYield = *pdVar4;
        pdVar4 = pdVar4 + (ulong)bVar11 * -2 + 1;
        pLVar6 = (LArNESTResult *)((long)pLVar6 + (ulong)bVar11 * -0x10 + 8);
      }
      __l_01._M_len = 10;
      __l_01._M_array = (iterator)&local_808;
      std::vector<double,_std::allocator<double>_>::insert
                (&electric_field,(const_iterator)0x0,__l_01);
    }
    else {
      local_808.yields.Nion = 10000.0;
      local_808.yields.Lindhard = 20000.0;
      local_808.yields.Ne = 1000.0;
      local_808.yields.Nex = 5000.0;
      local_808.yields.LightYield = 100.0;
      local_808.yields.Nph = 500.0;
      local_808.yields.TotalYield = 1.0;
      local_808.yields.QuantaYield = 50.0;
      __l_03._M_len = 8;
      __l_03._M_array = (iterator)&local_808;
      std::vector<double,_std::allocator<double>_>::insert
                (&electric_field,(const_iterator)0x0,__l_03);
    }
    for (uVar10 = 0;
        uVar10 < (ulong)((long)electric_field.super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)electric_field.super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3); uVar10 = uVar10 + 1)
    {
      for (lVar7 = 0; lVar7 != 50000; lVar7 = lVar7 + 1) {
        std::vector<double,_std::allocator<double>_>::vector(&Nph,__n,(allocator_type *)&local_808);
        std::vector<double,_std::allocator<double>_>::vector(&Ne,__n,(allocator_type *)&local_808);
        std::vector<double,_std::allocator<double>_>::vector(&Nex,__n,(allocator_type *)&local_808);
        std::vector<double,_std::allocator<double>_>::vector(&Nion,__n,(allocator_type *)&local_808)
        ;
        for (sVar9 = 0; __n != sVar9; sVar9 = sVar9 + 1) {
          NEST::LArNEST::FullCalculation
                    (&local_808,&larnest,
                     particle_types.
                     super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar8],
                     energy_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar7],0.0,
                     electric_field.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar10],local_928,false);
          NEST::LArNESTResult::operator=(&result,&local_808);
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    (&local_808.photon_times.super__Vector_base<double,_std::allocator<double>_>);
          Nph.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[sVar9] = result.fluctuations.NphFluctuation;
          Ne.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[sVar9] = result.fluctuations.NeFluctuation;
          Nex.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[sVar9] = result.fluctuations.NexFluctuation;
          Nion.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[sVar9] = result.fluctuations.NionFluctuation;
        }
        local_9b0 = 0.0;
        for (pdVar3 = Nph.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar3 != Nph.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish; pdVar3 = pdVar3 + 1) {
          local_9b0 = local_9b0 + *pdVar3;
        }
        local_9b8 = 0.0;
        for (pdVar3 = Ne.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar3 != Ne.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish; pdVar3 = pdVar3 + 1) {
          local_9b8 = local_9b8 + *pdVar3;
        }
        local_9b0 = local_9b0 / dVar16;
        local_9a0 = 0.0;
        for (pdVar3 = Nex.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar3 != Nex.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish; pdVar3 = pdVar3 + 1) {
          local_9a0 = local_9a0 + *pdVar3;
        }
        local_9b8 = local_9b8 / dVar16;
        local_9a8 = 0.0;
        for (pdVar3 = Nion.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar3 != Nion.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish; pdVar3 = pdVar3 + 1) {
          local_9a8 = local_9a8 + *pdVar3;
        }
        dVar12 = 0.0;
        for (lVar5 = 0;
            (long)Nph.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)Nph.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3 != lVar5; lVar5 = lVar5 + 1) {
          dVar17 = (Nph.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar5] +
                   Ne.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar5]) - (local_9b0 + local_9b8);
          dVar12 = dVar12 + dVar17 * dVar17;
        }
        dVar12 = dVar12 / dVar16;
        if (dVar12 < 0.0) {
          dVar12 = sqrt(dVar12);
        }
        else {
          dVar12 = SQRT(dVar12);
        }
        dVar17 = 0.0;
        for (lVar5 = 0;
            (long)Nph.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)Nph.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3 != lVar5; lVar5 = lVar5 + 1) {
          dVar17 = dVar17 + (Nph.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar5] - local_9b0) *
                            (Nph.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar5] - local_9b0);
        }
        dVar17 = dVar17 / dVar16;
        if (dVar17 < 0.0) {
          dVar17 = sqrt(dVar17);
        }
        else {
          dVar17 = SQRT(dVar17);
        }
        dVar13 = 0.0;
        for (lVar5 = 0;
            (long)Ne.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)Ne.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3 != lVar5; lVar5 = lVar5 + 1) {
          dVar13 = dVar13 + (Ne.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar5] - local_9b8) *
                            (Ne.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar5] - local_9b8);
        }
        dVar13 = dVar13 / dVar16;
        if (dVar13 < 0.0) {
          dVar13 = sqrt(dVar13);
        }
        else {
          dVar13 = SQRT(dVar13);
        }
        dVar14 = 0.0;
        for (lVar5 = 0;
            (long)Nex.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)Nex.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3 != lVar5; lVar5 = lVar5 + 1) {
          dVar18 = Nex.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar5] - local_9a0 / dVar16;
          dVar14 = dVar14 + dVar18 * dVar18;
        }
        dVar14 = dVar14 / dVar16;
        if (dVar14 < 0.0) {
          dVar14 = sqrt(dVar14);
        }
        else {
          dVar14 = SQRT(dVar14);
        }
        dVar18 = 0.0;
        for (lVar5 = 0;
            (long)Nion.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)Nion.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3 != lVar5; lVar5 = lVar5 + 1) {
          dVar19 = Nion.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar5] - local_9a8 / dVar16;
          dVar18 = dVar18 + dVar19 * dVar19;
        }
        dVar18 = dVar18 / dVar16;
        if (dVar18 < 0.0) {
          dVar18 = sqrt(dVar18);
        }
        else {
          dVar18 = SQRT(dVar18);
        }
        poVar2 = std::operator<<((ostream *)&output_file,
                                 (string *)
                                 (particle_type.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar8));
        std::operator<<(poVar2,",");
        poVar2 = std::ostream::_M_insert<double>
                           (energy_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar7]);
        std::operator<<(poVar2,",");
        poVar2 = std::ostream::_M_insert<double>
                           (electric_field.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar10]);
        std::operator<<(poVar2,",");
        poVar2 = std::ostream::_M_insert<double>
                           ((local_9b0 + local_9b8) /
                            energy_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar7]);
        std::operator<<(poVar2,",");
        poVar2 = std::ostream::_M_insert<double>
                           (local_9b8 /
                            energy_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar7]);
        std::operator<<(poVar2,",");
        poVar2 = std::ostream::_M_insert<double>
                           (local_9b0 /
                            energy_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar7]);
        std::operator<<(poVar2,",");
        poVar2 = std::ostream::_M_insert<double>(local_9b0);
        std::operator<<(poVar2,",");
        poVar2 = std::ostream::_M_insert<double>(local_9b8);
        std::operator<<(poVar2,",");
        poVar2 = std::ostream::_M_insert<double>(local_9a0 / dVar16);
        std::operator<<(poVar2,",");
        poVar2 = std::ostream::_M_insert<double>(local_9a8 / dVar16);
        std::operator<<(poVar2,",");
        poVar2 = std::ostream::_M_insert<double>
                           (dVar12 / energy_vals.super__Vector_base<double,_std::allocator<double>_>
                                     ._M_impl.super__Vector_impl_data._M_start[lVar7]);
        std::operator<<(poVar2,",");
        poVar2 = std::ostream::_M_insert<double>
                           (dVar13 / energy_vals.super__Vector_base<double,_std::allocator<double>_>
                                     ._M_impl.super__Vector_impl_data._M_start[lVar7]);
        std::operator<<(poVar2,",");
        poVar2 = std::ostream::_M_insert<double>
                           (dVar17 / energy_vals.super__Vector_base<double,_std::allocator<double>_>
                                     ._M_impl.super__Vector_impl_data._M_start[lVar7]);
        std::operator<<(poVar2,",");
        poVar2 = std::ostream::_M_insert<double>(dVar17);
        std::operator<<(poVar2,",");
        poVar2 = std::ostream::_M_insert<double>(dVar13);
        std::operator<<(poVar2,",");
        poVar2 = std::ostream::_M_insert<double>(dVar14);
        std::operator<<(poVar2,",");
        poVar2 = std::ostream::_M_insert<double>(dVar18);
        std::operator<<(poVar2,"\n");
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&Nion.super__Vector_base<double,_std::allocator<double>_>);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&Nex.super__Vector_base<double,_std::allocator<double>_>);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&Ne.super__Vector_base<double,_std::allocator<double>_>);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&Nph.super__Vector_base<double,_std::allocator<double>_>);
      }
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&electric_field.super__Vector_base<double,_std::allocator<double>_>);
    uVar8 = uVar8 + 1;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&output_file);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&result.photon_times.super__Vector_base<double,_std::allocator<double>_>);
  NEST::LArNEST::~LArNEST(&larnest);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&particle_type);
  std::_Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>::~_Vector_base
            (&particle_types.
              super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&energy_vals.super__Vector_base<double,_std::allocator<double>_>);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  // this sample program takes can take two arguments,
  // (optional) 1) density - the density of the LAr to use
  // (optional) 2) seed - a seed for the random number generator

  double density = 1.393;
  uint64_t seed = 0;
  uint64_t num_events = 100;
  if (argc > 1) {
    density = atof(argv[1]);
  }
  if (argc > 2) {
    seed = atoi(argv[2]);
  }
  if (argc > 3) {
    num_events = atoi(argv[3]);
  }

  // set up energy steps
  int num_energy_steps = 50000;
  std::vector<double> energy_vals;
  double start_val = .1;
  double end_val = 1000;
  double step_size = (end_val - start_val) / num_energy_steps;

  for (size_t i = 0; i < num_energy_steps; i++) {
    energy_vals.emplace_back(start_val + step_size * i);
  }
  std::vector<NEST::LArInteraction> particle_types = {
      NEST::LArInteraction::NR, NEST::LArInteraction::ER,
      NEST::LArInteraction::Alpha};
  std::vector<std::string> particle_type = {"NR", "ER", "Alpha"};

  LArDetector* detector = new LArDetector();
  // Construct NEST class using detector object
  NEST::LArNEST larnest(detector);
  // Set random seed of RandomGen class
  RandomGen::rndm()->SetSeed(seed);

  // Construct NEST objects for storing calculation results
  NEST::LArNESTResult result;
  std::ofstream output_file;

  output_file.open("fluctuation_benchmarks.csv");
  output_file << "type,energy,efield,TotalYield,QuantaYield,LightYield,Nph,Ne,"
                 "Nex,Nion,TotalYield_std,QuantaYield_std,LightYield_std,Nph_"
                 "std,Ne_std,Nex_std,Nion_std\n";

  // iterate over electric field values
  for (size_t k = 0; k < particle_types.size(); k++) {
    std::vector<double> electric_field;
    if (particle_types[k] == NEST::LArInteraction::NR) {
      electric_field.insert(electric_field.end(), {1, 50, 100, 200, 250, 500,
                                                   1000, 1500, 1750, 2000});
    } else if (particle_types[k] == NEST::LArInteraction::ER) {
      electric_field.insert(electric_field.end(), {1, 100, 200, 600, 1000, 1500,
                                                   2500, 6000, 9000, 9500});
    } else {
      electric_field.insert(electric_field.end(),
                            {1, 50, 100, 500, 1000, 5000, 10000, 20000});
    }
    // iterate over number of events
    for (size_t v = 0; v < electric_field.size(); v++) {
      for (size_t i = 0; i < num_energy_steps; i++) {
        std::vector<double> Nph(num_events);
        std::vector<double> Ne(num_events);
        std::vector<double> Nex(num_events);
        std::vector<double> Nion(num_events);
        // collect statistics for each event
        for (size_t j = 0; j < num_events; j++) {
          result = larnest.FullCalculation(particle_types[k], energy_vals[i], 0,
                                           electric_field[v], density, false);
          Nph[j] = double(result.fluctuations.NphFluctuation);
          Ne[j] = double(result.fluctuations.NeFluctuation);
          Nex[j] = double(result.fluctuations.NexFluctuation);
          Nion[j] = double(result.fluctuations.NionFluctuation);
        }
        double Nph_mean =
            std::accumulate(Nph.begin(), Nph.end(), 0.0) / double(num_events);
        double Ne_mean =
            std::accumulate(Ne.begin(), Ne.end(), 0.0) / double(num_events);
        double Nex_mean =
            std::accumulate(Nex.begin(), Nex.end(), 0.0) / double(num_events);
        double Nion_mean =
            std::accumulate(Nion.begin(), Nion.end(), 0.0) / double(num_events);

        double Nq_mean = Nph_mean + Ne_mean;
        double Nq_std = 0.0;
        double Nph_std = 0.0;
        double Ne_std = 0.0;
        double Nex_std = 0.0;
        double Nion_std = 0.0;

        for (size_t ii = 0; ii < Nph.size(); ii++) {
          Nq_std += (Nph[ii] + Ne[ii] - Nq_mean) * (Nph[ii] + Ne[ii] - Nq_mean);
        }
        Nq_std = std::sqrt(Nq_std / double(num_events));

        for (size_t ii = 0; ii < Nph.size(); ii++) {
          Nph_std += (Nph[ii] - Nph_mean) * (Nph[ii] - Nph_mean);
        }
        Nph_std = std::sqrt(Nph_std / double(num_events));

        for (size_t ii = 0; ii < Ne.size(); ii++) {
          Ne_std += (Ne[ii] - Ne_mean) * (Ne[ii] - Ne_mean);
        }
        Ne_std = std::sqrt(Ne_std / double(num_events));

        for (size_t ii = 0; ii < Nex.size(); ii++) {
          Nex_std += (Nex[ii] - Nex_mean) * (Nex[ii] - Nex_mean);
        }
        Nex_std = std::sqrt(Nex_std / double(num_events));

        for (size_t ii = 0; ii < Nion.size(); ii++) {
          Nion_std += (Nion[ii] - Nion_mean) * (Nion[ii] - Nion_mean);
        }
        Nion_std = std::sqrt(Nion_std / double(num_events));

        output_file << particle_type[k] << ",";
        output_file << energy_vals[i] << ",";
        output_file << electric_field[v] << ",";
        output_file << (Nq_mean / energy_vals[i]) << ",";
        output_file << (Ne_mean / energy_vals[i]) << ",";
        output_file << (Nph_mean / energy_vals[i]) << ",";
        output_file << Nph_mean << ",";
        output_file << Ne_mean << ",";
        output_file << Nex_mean << ",";
        output_file << Nion_mean << ",";
        output_file << (Nq_std / energy_vals[i]) << ",";
        output_file << (Ne_std / energy_vals[i]) << ",";
        output_file << (Nph_std / energy_vals[i]) << ",";
        output_file << Nph_std << ",";
        output_file << Ne_std << ",";
        output_file << Nex_std << ",";
        output_file << Nion_std << "\n";
      }
    }
  }
  output_file.close();
  return 0;
}